

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_zp_chain_barcode.cpp
# Opt level: O1

void __thiscall
Chain_matrix_zp_barcode_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
::test_method(Chain_matrix_zp_barcode_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
              *this)

{
  Column_zp_settings *this_00;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  vStack_e8;
  undefined1 local_d0 [192];
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this_00,5);
  local_d0._0_8_ = this_00;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  ::
  Chain_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
              *)(local_d0 + 8),&vStack_e8,this_00);
  test_chain_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            ((Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
              *)local_d0);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
             *)local_d0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&vStack_e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_zp_barcode_operation, Matrix, full_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);
  test_chain_operation<Matrix>(m);
}